

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t validate_tile_data(exr_context_t f,exr_priv_part_t curpart)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  byte bVar5;
  exr_result_t eVar6;
  uint uVar7;
  long in_RSI;
  long in_RDI;
  int c;
  exr_tile_round_mode_t rndmode;
  exr_tile_level_mode_t levmode;
  exr_attr_chlist_t *channels;
  int maxtileh;
  int maxtilew;
  exr_attr_tiledesc_t *desc;
  int local_3c;
  
  if ((*(int *)(in_RSI + 4) == 1) || (*(int *)(in_RSI + 4) == 3)) {
    iVar1 = *(int *)(in_RDI + 0x70);
    iVar2 = *(int *)(in_RDI + 0x74);
    piVar3 = *(int **)(*(long *)(in_RSI + 0x20) + 0x18);
    if (*(long *)(in_RSI + 0x60) == 0) {
      eVar6 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xd,"\'tiles\' attribute for tiled file not found");
      return eVar6;
    }
    if (*(int *)(*(long *)(in_RSI + 0x60) + 0x14) != 0x15) {
      eVar6 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x10,
                         "\'tiles\' attribute has wrong data type, expect tile description");
      return eVar6;
    }
    puVar4 = *(uint **)(*(long *)(in_RSI + 0x60) + 0x18);
    bVar5 = (byte)puVar4[2] & 0xf;
    uVar7 = (int)(uint)(byte)puVar4[2] >> 4;
    if ((((*puVar4 == 0) || (puVar4[1] == 0)) || (0x1fffffff < *puVar4)) || (0x1fffffff < puVar4[1])
       ) {
      eVar6 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Invalid tile description size (%u x %u)",*puVar4,puVar4[1]);
      return eVar6;
    }
    if ((0 < iVar1) && (iVar1 < (int)*puVar4)) {
      eVar6 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Width of tile exceeds max size (%d vs max %d)",*puVar4,iVar1);
      return eVar6;
    }
    if ((0 < iVar2) && (iVar2 < (int)puVar4[1])) {
      eVar6 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Width of tile exceeds max size (%d vs max %d)",puVar4[1],iVar2)
      ;
      return eVar6;
    }
    if (2 < bVar5) {
      eVar6 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Invalid level mode (%d) in tile description header",bVar5);
      return eVar6;
    }
    if (1 < uVar7) {
      eVar6 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0xe,"Invalid rounding mode (%d) in tile description header",uVar7);
      return eVar6;
    }
    for (local_3c = 0; local_3c < *piVar3; local_3c = local_3c + 1) {
      if (*(int *)(*(long *)(piVar3 + 2) + (long)local_3c * 0x20 + 0x18) != 1) {
        eVar6 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': x subsampling factor is not 1 (%d) for a tiled image",
                           *(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_3c * 0x20 + 8),
                           *(undefined4 *)(*(long *)(piVar3 + 2) + (long)local_3c * 0x20 + 0x18));
        return eVar6;
      }
      if (*(int *)(*(long *)(piVar3 + 2) + (long)local_3c * 0x20 + 0x1c) != 1) {
        eVar6 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "channel \'%s\': y subsampling factor is not 1 (%d) for a tiled image",
                           *(undefined8 *)(*(long *)(piVar3 + 2) + (long)local_3c * 0x20 + 8),
                           *(undefined4 *)(*(long *)(piVar3 + 2) + (long)local_3c * 0x20 + 0x1c));
        return eVar6;
      }
    }
  }
  return 0;
}

Assistant:

static exr_result_t
validate_tile_data (exr_context_t f, exr_priv_part_t curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_TILED ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_tiledesc_t* desc;
        const int                  maxtilew = f->max_tile_w;
        const int                  maxtileh = f->max_tile_h;
        const exr_attr_chlist_t*   channels = curpart->channels->chlist;
        exr_tile_level_mode_t      levmode;
        exr_tile_round_mode_t      rndmode;

        if (!curpart->tiles)
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'tiles' attribute for tiled file not found");
        else if (curpart->tiles->type != EXR_ATTR_TILEDESC)
            return f->print_error (
                f,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'tiles' attribute has wrong data type, expect tile description");

        desc    = curpart->tiles->tiledesc;
        levmode = EXR_GET_TILE_LEVEL_MODE (*desc);
        rndmode = EXR_GET_TILE_ROUND_MODE (*desc);

        if (desc->x_size == 0 || desc->y_size == 0 ||
            desc->x_size > (uint32_t) (INT_MAX / 4) ||
            desc->y_size > (uint32_t) (INT_MAX / 4))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid tile description size (%u x %u)",
                desc->x_size,
                desc->y_size);
        if (maxtilew > 0 && maxtilew < (int) (desc->x_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->x_size,
                maxtilew);
        if (maxtileh > 0 && maxtileh < (int) (desc->y_size))
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Width of tile exceeds max size (%d vs max %d)",
                (int) desc->y_size,
                maxtileh);

        if ((int) levmode < EXR_TILE_ONE_LEVEL ||
            (int) levmode >= EXR_TILE_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid level mode (%d) in tile description header",
                (int) levmode);

        if ((int) rndmode < EXR_TILE_ROUND_DOWN ||
            (int) rndmode >= EXR_TILE_ROUND_LAST_TYPE)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "Invalid rounding mode (%d) in tile description header",
                (int) rndmode);

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a tiled image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}